

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# login_message.cpp
# Opt level: O0

ByteBuffer * __thiscall
bidfx_public_api::price::pixie::LoginMessage::Encode
          (ByteBuffer *__return_storage_ptr__,LoginMessage *this,int version)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  undefined1 local_60 [8];
  ByteBuffer message_frame;
  bool version4;
  size_t sStack_28;
  bool version2;
  size_t message_len;
  int version_local;
  LoginMessage *this_local;
  
  lVar1 = std::__cxx11::string::size();
  lVar2 = std::__cxx11::string::size();
  lVar3 = std::__cxx11::string::size();
  lVar4 = std::__cxx11::string::size();
  sStack_28 = lVar1 + 1 + lVar2 + lVar3 + lVar4;
  message_frame.capacity_._7_1_ = 1 < version;
  if ((bool)message_frame.capacity_._7_1_) {
    lVar1 = std::__cxx11::string::size();
    lVar2 = std::__cxx11::string::size();
    sStack_28 = lVar1 + lVar2 + sStack_28;
  }
  message_frame.capacity_._6_1_ = 3 < version;
  if ((bool)message_frame.capacity_._6_1_) {
    lVar1 = std::__cxx11::string::size();
    lVar2 = std::__cxx11::string::size();
    lVar3 = std::__cxx11::string::size();
    lVar4 = std::__cxx11::string::size();
    sStack_28 = lVar1 + lVar2 + lVar3 + lVar4 + sStack_28;
  }
  tools::ByteBuffer::ByteBuffer((ByteBuffer *)local_60,sStack_28);
  tools::ByteBuffer::WriteByte((ByteBuffer *)local_60,'L');
  std::__cxx11::string::string((string *)&local_90,(string *)&this->username_);
  tools::Varint::WriteString((OutputStream *)&message_frame,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string((string *)&local_b0,(string *)&this->password_);
  tools::Varint::WriteString((OutputStream *)&message_frame,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string((string *)&local_d0,(string *)&this->alias_);
  tools::Varint::WriteString((OutputStream *)&message_frame,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  if ((message_frame.capacity_._7_1_ & 1) != 0) {
    std::__cxx11::string::string((string *)&local_f0,(string *)&this->application_);
    tools::Varint::WriteString((OutputStream *)&message_frame,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::string((string *)&local_110,(string *)&this->application_version_);
    tools::Varint::WriteString((OutputStream *)&message_frame,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
  }
  if ((message_frame.capacity_._6_1_ & 1) != 0) {
    std::__cxx11::string::string((string *)&local_130,(string *)&this->api_);
    tools::Varint::WriteString((OutputStream *)&message_frame,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::string((string *)&local_150,(string *)&this->api_version_);
    tools::Varint::WriteString((OutputStream *)&message_frame,&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::string((string *)&local_170,(string *)&this->product_);
    tools::Varint::WriteString((OutputStream *)&message_frame,&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::string((string *)&local_190,(string *)&this->product_serial_number_);
    tools::Varint::WriteString((OutputStream *)&message_frame,&local_190);
    std::__cxx11::string::~string((string *)&local_190);
  }
  tools::ByteBuffer::ByteBuffer(__return_storage_ptr__,(ByteBuffer *)local_60);
  tools::ByteBuffer::~ByteBuffer((ByteBuffer *)local_60);
  return __return_storage_ptr__;
}

Assistant:

ByteBuffer LoginMessage::Encode(int version) const
{
    size_t message_len = sizeof(PixieMessageType::LOGIN) + sizeof(unsigned char) * username_.size() +
                      sizeof(unsigned char) * password_.size() + sizeof(unsigned char) * alias_.size() +
                      sizeof(unsigned char) * password_.size();

    bool version2 = version >= PixieVersion::VERSION2;
    if (version2)
    {
        message_len += sizeof(unsigned char) * application_.size() + sizeof(unsigned char) * application_version_.size();
    }

    bool version4 = version >= PixieVersion::VERSION4;
    if (version4)
    {
        message_len += sizeof(unsigned char) * api_.size() + sizeof(unsigned char) * api_version_.size() +
                       sizeof(unsigned char) * product_.size() + sizeof(unsigned char) * product_serial_number_.size();
    }

    ByteBuffer message_frame(message_len);
    message_frame.WriteByte(PixieMessageType::LOGIN);
    Varint::WriteString(message_frame, username_);
    Varint::WriteString(message_frame, password_);
    Varint::WriteString(message_frame, alias_);

    if (version2)
    {
        Varint::WriteString(message_frame, application_);
        Varint::WriteString(message_frame, application_version_);
    }

    if (version4)
    {
        Varint::WriteString(message_frame, api_);
        Varint::WriteString(message_frame, api_version_);
        Varint::WriteString(message_frame, product_);
        Varint::WriteString(message_frame, product_serial_number_);
    }

    return std::move(message_frame);
}